

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O3

Vec_Int_t *
findNewMonotone(Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
               monotoneVectorsStruct *monotoneVectorArg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  Aig_Man_t *pAig_00;
  Vec_Int_t *p;
  Vec_Int_t *pVVar7;
  int iVar8;
  ulong uVar9;
  int poMarker;
  Pdr_Par_t Pars;
  uint local_c4;
  Pdr_Par_t local_c0;
  
  uVar1 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar2 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  pAig_00 = createMonotoneTester(pAig,aigPoIndicesArg,monotoneVectorArg,(int *)&local_c4);
  iVar3 = pAig->nRegs;
  iVar4 = pAig->nObjs[3];
  p = (Vec_Int_t *)calloc(1,0x10);
  uVar9 = (ulong)local_c4;
  printf("\nSaig_ManPoNum(pAigNew) = %d, poMarker = %d\n",(ulong)(uint)pAig_00->nTruePos,uVar9);
  pVVar7 = (Vec_Int_t *)0x0;
  if ((int)local_c4 < pAig_00->nTruePos) {
    do {
      if (((int)local_c4 < 0) || (iVar8 = (int)uVar9, pAig_00->vCos->nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pAig_00->vCos->pArray[uVar9];
      if (((ulong)pvVar5 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
      }
      *(byte *)((long)pvVar5 + 8U) = *(byte *)((long)pvVar5 + 8U) ^ 1;
      Pdr_ManSetDefaultParams(&local_c0);
      local_c0.fVerbose = 0;
      iVar6 = Pdr_ManSolve(pAig_00,&local_c0);
      if (iVar6 == 1) {
        printf("\ni = %d, RetValue = %d : %s (Frame %d)\n",
               (ulong)(uint)(((iVar3 + iVar2) - iVar4) + iVar8),1,"Property Proved",0xffffffff);
        Vec_IntPush(p,iVar8 + ~uVar1 + iVar2);
      }
      *(byte *)((long)pvVar5 + 8U) = *(byte *)((long)pvVar5 + 8U) ^ 1;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < pAig_00->nTruePos);
    pVVar7 = (Vec_Int_t *)0x0;
    if (0 < p->nSize) {
      pVVar7 = p;
    }
  }
  return pVVar7;
}

Assistant:

Vec_Int_t *findNewMonotone( Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg )
{
	Aig_Man_t *pAigNew;
	Aig_Obj_t *pObjTargetPo;
	int poMarker, oldPoNum;
	int i, RetValue;
	Pdr_Par_t Pars, * pPars = &Pars;
	Abc_Cex_t * pCex = NULL;
	Vec_Int_t *vMonotoneIndex;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	//Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	//Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	//Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;

	pAigNew = createMonotoneTester(pAig, aigPoIndicesArg, monotoneVectorArg, &poMarker );
	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);

	vMonotoneIndex = Vec_IntAlloc(0);
	printf("\nSaig_ManPoNum(pAigNew) = %d, poMarker = %d\n", Saig_ManPoNum(pAigNew), poMarker);
	for( i=poMarker; i<Saig_ManPoNum(pAigNew); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAigNew, i );
		Aig_ObjChild0Flip( pObjTargetPo );

		Pdr_ManSetDefaultParams( pPars );
		pCex = NULL;
		pPars->fVerbose = 0;
		//pPars->iOutput = i;
		//RetValue = Pdr_ManSolve( pAigNew, pPars, &pCex );	
		RetValue = Pdr_ManSolve( pAigNew, pPars );	
		if( RetValue == 1 )
		{
			printf("\ni = %d, RetValue = %d : %s (Frame %d)\n", i - oldPoNum + hintSingalBeginningMarkerLocal, RetValue, "Property Proved", pCex? (pCex)->iFrame : -1 );
			Vec_IntPush( vMonotoneIndex, i - (pendingSignalIndexLocal + 1) + hintSingalBeginningMarkerLocal);
		}
		Aig_ObjChild0Flip( pObjTargetPo );
	}
	
	if( Vec_IntSize( vMonotoneIndex ) > 0 )
		return vMonotoneIndex;
	else
		return NULL;
}